

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  Reader *pRVar1;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  Fault local_378;
  Fault f_3;
  Reader local_340;
  Fault local_310;
  Fault f_2;
  Reader local_2d8;
  Fault local_2a8;
  Fault f_1;
  Reader local_270;
  Reader local_240;
  Reader local_210;
  Reader local_1e0;
  Reader local_1b0;
  Fault local_180;
  Fault f;
  Maybe<capnp::schema::Node::Reader> local_140;
  Reader local_108;
  Maybe<capnp::schema::Field::Reader> local_c8;
  Maybe<capnp::schema::Node::Reader> local_90;
  Reader local_58;
  UpgradeToStructMode local_24;
  Reader *pRStack_20;
  UpgradeToStructMode upgradeToStructMode_local;
  Reader *replacement_local;
  Reader *type_local;
  CompatibilityChecker *this_local;
  
  local_24 = upgradeToStructMode;
  pRStack_20 = replacement;
  replacement_local = type;
  type_local = (Reader *)this;
  WVar3 = capnp::schema::Type::Reader::which(replacement);
  WVar4 = capnp::schema::Type::Reader::which(replacement_local);
  if (WVar3 == WVar4) {
    WVar3 = capnp::schema::Type::Reader::which(replacement_local);
    switch(WVar3) {
    case VOID:
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case FLOAT32:
    case FLOAT64:
    case TEXT:
    case DATA:
    case ANY_POINTER:
      break;
    case LIST:
      capnp::schema::Type::Reader::getList(&local_1e0,replacement_local);
      capnp::schema::Type::List::Reader::getElementType(&local_1b0,&local_1e0);
      capnp::schema::Type::Reader::getList(&local_240,pRStack_20);
      capnp::schema::Type::List::Reader::getElementType(&local_210,&local_240);
      checkCompatibility(this,&local_1b0,&local_210,ALLOW_UPGRADE_TO_STRUCT);
      break;
    case ENUM:
      capnp::schema::Type::Reader::getEnum(&local_270,pRStack_20);
      uVar5 = capnp::schema::Type::Enum::Reader::getTypeId(&local_270);
      capnp::schema::Type::Reader::getEnum((Reader *)&f_1,replacement_local);
      uVar6 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)&f_1);
      if (uVar5 != uVar6) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  (&local_2a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x3e5,FAILED,"replacement.getEnum().getTypeId() == type.getEnum().getTypeId()",
                   "\"type changed enum type\"",(char (*) [23])"type changed enum type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_2a8);
      }
      break;
    case STRUCT:
      capnp::schema::Type::Reader::getStruct(&local_2d8,pRStack_20);
      uVar5 = capnp::schema::Type::Struct::Reader::getTypeId(&local_2d8);
      capnp::schema::Type::Reader::getStruct((Reader *)&f_2,replacement_local);
      uVar6 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)&f_2);
      if (uVar5 != uVar6) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                  (&local_310,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x3f1,FAILED,
                   "replacement.getStruct().getTypeId() == type.getStruct().getTypeId()",
                   "\"type changed to incompatible struct type\"",
                   (char (*) [41])"type changed to incompatible struct type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_310);
      }
      break;
    case INTERFACE:
      capnp::schema::Type::Reader::getInterface(&local_340,pRStack_20);
      uVar5 = capnp::schema::Type::Interface::Reader::getTypeId(&local_340);
      capnp::schema::Type::Reader::getInterface((Reader *)&f_3,replacement_local);
      uVar6 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)&f_3);
      if (uVar5 != uVar6) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  (&local_378,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x3f6,FAILED,
                   "replacement.getInterface().getTypeId() == type.getInterface().getTypeId()",
                   "\"type changed to incompatible interface type\"",
                   (char (*) [44])"type changed to incompatible interface type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_378);
      }
    }
  }
  else {
    bVar2 = capnp::schema::Type::Reader::isData(pRStack_20);
    if ((bVar2) && (bVar2 = canUpgradeToData(this,replacement_local), bVar2)) {
      replacementIsNewer(this);
    }
    else {
      bVar2 = capnp::schema::Type::Reader::isData(replacement_local);
      if ((bVar2) && (bVar2 = canUpgradeToData(this,pRStack_20), bVar2)) {
        replacementIsOlder(this);
      }
      else {
        bVar2 = capnp::schema::Type::Reader::isAnyPointer(pRStack_20);
        if ((bVar2) && (bVar2 = canUpgradeToAnyPointer(this,replacement_local), bVar2)) {
          replacementIsNewer(this);
        }
        else {
          bVar2 = capnp::schema::Type::Reader::isAnyPointer(replacement_local);
          if ((bVar2) && (bVar2 = canUpgradeToAnyPointer(this,pRStack_20), bVar2)) {
            replacementIsOlder(this);
          }
          else {
            if (local_24 == ALLOW_UPGRADE_TO_STRUCT) {
              bVar2 = capnp::schema::Type::Reader::isStruct(replacement_local);
              pRVar1 = pRStack_20;
              if (bVar2) {
                capnp::schema::Type::Reader::getStruct(&local_58,replacement_local);
                uVar5 = capnp::schema::Type::Struct::Reader::getTypeId(&local_58);
                kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_90,(void *)0x0);
                kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_c8,(void *)0x0);
                checkUpgradeToStruct(this,pRVar1,uVar5,&local_90,&local_c8);
                kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_c8);
                kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_90);
                return;
              }
              bVar2 = capnp::schema::Type::Reader::isStruct(pRStack_20);
              pRVar1 = replacement_local;
              if (bVar2) {
                capnp::schema::Type::Reader::getStruct(&local_108,pRStack_20);
                uVar5 = capnp::schema::Type::Struct::Reader::getTypeId(&local_108);
                kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_140,(void *)0x0);
                kj::Maybe<capnp::schema::Field::Reader>::Maybe
                          ((Maybe<capnp::schema::Field::Reader> *)&f,(void *)0x0);
                checkUpgradeToStruct
                          (this,pRVar1,uVar5,&local_140,(Maybe<capnp::schema::Field::Reader> *)&f);
                kj::Maybe<capnp::schema::Field::Reader>::~Maybe
                          ((Maybe<capnp::schema::Field::Reader> *)&f);
                kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_140);
                return;
              }
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                      (&local_180,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x3c9,FAILED,(char *)0x0,"\"a type was changed\"",
                       (char (*) [19])"a type was changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault(&local_180);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }